

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTree.c
# Opt level: O1

int Map_LibraryReadFileTreeStr
              (Map_SuperLib_t *pLib,Mio_Library_t *pGenlib,Vec_Str_t *vStr,char *pFileName)

{
  byte bVar1;
  Map_SuperLib_t *pMVar2;
  Map_SuperLib_t *pMVar3;
  int *piVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  char *pName1;
  Map_Super_t **ppMVar8;
  Map_Super_t *pMVar9;
  ProgressBar *p;
  long lVar10;
  uint uVar11;
  byte *pbVar12;
  int *piVar13;
  long lVar14;
  int nPos;
  char pBuffer [5000];
  int local_13d4;
  int *local_13d0;
  Map_SuperLib_t *local_13c8;
  int *local_13c0;
  byte local_13b8 [5000];
  
  local_13d4 = 0;
  iVar5 = Vec_StrGets((char *)local_13b8,5000,vStr,&local_13d4);
  if (iVar5 == 0) {
    return 0;
  }
  pbVar12 = local_13b8;
  local_13d0 = (int *)pFileName;
  local_13c8 = pLib;
  while (uVar6 = (ulong)*pbVar12, uVar6 < 0x24) {
    if ((0x100002400U >> (uVar6 & 0x3f) & 1) == 0) {
      if ((0x800000001U >> (uVar6 & 0x3f) & 1) == 0) break;
      iVar5 = Vec_StrGets((char *)local_13b8,5000,vStr,&local_13d4);
      pbVar12 = local_13b8;
      if (iVar5 == 0) {
        return 0;
      }
    }
    else {
      pbVar12 = pbVar12 + 1;
    }
  }
  pcVar7 = strtok((char *)pbVar12," \t\r\n");
  pMVar2 = local_13c8;
  local_13c8->pGenlib = pGenlib;
  if (pGenlib != (Mio_Library_t *)0x0) {
    pName1 = Mio_LibraryReadName(pGenlib);
    iVar5 = Map_LibraryCompareLibNames(pName1,pcVar7);
    if (iVar5 == 0) {
      iVar5 = Vec_StrGets((char *)local_13b8,5000,vStr,&local_13d4);
      if (iVar5 == 0) {
        return 0;
      }
      __isoc99_sscanf(local_13b8,"%d\n",&pMVar2->nVarsMax);
      if (pMVar2->nVarsMax - 0xbU < 0xfffffff7) {
        pcVar7 = "Suspicious number of variables (%d).\n";
      }
      else {
        iVar5 = Vec_StrGets((char *)local_13b8,5000,vStr,&local_13d4);
        if (iVar5 == 0) {
          return 0;
        }
        __isoc99_sscanf(local_13b8,"%d\n",&pMVar2->nSupersReal);
        if (pMVar2->nSupersReal - 0x989681U < 0xff676980) {
          pcVar7 = "Suspicious number of gates (%d).\n";
        }
        else {
          iVar5 = Vec_StrGets((char *)local_13b8,5000,vStr,&local_13d4);
          if (iVar5 == 0) {
            return 0;
          }
          piVar13 = &pMVar2->nLines;
          __isoc99_sscanf(local_13b8,"%d\n",piVar13);
          if (0xff67697f < pMVar2->nLines - 0x989681U) {
            local_13c0 = &pMVar2->nSupersReal;
            ppMVar8 = (Map_Super_t **)malloc((ulong)(uint)pMVar2->nLines * 8 + 80000);
            pMVar3 = local_13c8;
            pMVar2->ppSupers = ppMVar8;
            uVar11 = pMVar2->nVarsMax;
            local_13d0 = piVar13;
            if (0 < (int)uVar11) {
              lVar14 = 0;
              do {
                pMVar9 = (Map_Super_t *)Extra_MmFixedEntryFetch(pMVar3->mmSupers);
                memset(pMVar9,0,0x100);
                pMVar9->Num = (int)lVar14;
                pMVar9->uTruth[0] = pMVar3->uTruths[lVar14][0];
                pMVar9->uTruth[1] = pMVar3->uTruths[lVar14][1];
                iVar5 = pMVar3->nVarsMax;
                if (0 < (long)iVar5) {
                  lVar10 = 0;
                  do {
                    *(undefined8 *)((long)&pMVar9->tDelaysR[0].Rise + lVar10) = 0xc61c3c00c61c3c00;
                    *(undefined8 *)((long)&pMVar9->tDelaysF[0].Rise + lVar10) = 0xc61c3c00c61c3c00;
                    lVar10 = lVar10 + 0xc;
                  } while ((long)iVar5 * 0xc != lVar10);
                }
                pMVar9->tDelaysR[lVar14].Rise = 0.0;
                pMVar9->tDelaysF[lVar14].Fall = 0.0;
                pMVar3->ppSupers[lVar14] = pMVar9;
                lVar14 = lVar14 + 1;
                uVar11 = pMVar3->nVarsMax;
              } while (lVar14 < (int)uVar11);
            }
            piVar13 = local_13d0;
            p = Extra_ProgressBarStart(_stdout,*local_13d0);
            iVar5 = Vec_StrGets((char *)local_13b8,5000,vStr,&local_13d4);
            pMVar2 = local_13c8;
            if (iVar5 != 0) {
              lVar14 = (long)(int)uVar11;
              pbVar12 = local_13b8;
LAB_003689d2:
              do {
                bVar1 = *pbVar12;
                if (bVar1 < 0xd) {
                  if (bVar1 != 0) {
                    if (bVar1 != 10) goto LAB_00368a10;
LAB_003689ef:
                    pbVar12 = pbVar12 + 1;
                    goto LAB_003689d2;
                  }
                  iVar5 = Vec_StrGets((char *)local_13b8,5000,vStr,&local_13d4);
                  piVar13 = local_13d0;
                }
                else {
                  if ((bVar1 == 0x20) || (bVar1 == 0xd)) goto LAB_003689ef;
LAB_00368a10:
                  pMVar9 = Map_LibraryReadGateTree
                                     (pMVar2,(char *)pbVar12,(int)lVar14,pMVar2->nVarsMax);
                  if (pMVar9 == (Map_Super_t *)0x0) {
                    Extra_ProgressBarStop(p);
                    return 0;
                  }
                  lVar10 = lVar14 + 1;
                  pMVar2->ppSupers[lVar14] = pMVar9;
                  if ((p == (ProgressBar *)0x0) || (p->nItemsNext <= lVar10)) {
                    Extra_ProgressBarUpdate_int(p,(int)lVar10,(char *)0x0);
                  }
                  iVar5 = Vec_StrGets((char *)local_13b8,5000,vStr,&local_13d4);
                  piVar13 = local_13d0;
                  lVar14 = lVar10;
                }
                pbVar12 = local_13b8;
                local_13d0 = piVar13;
              } while (iVar5 != 0);
              uVar11 = (uint)lVar14;
            }
            Extra_ProgressBarStop(p);
            piVar4 = local_13c0;
            if (uVar11 != *piVar13) {
              printf("The number of lines read (%d) is different from what the file says (%d).\n",
                     (ulong)uVar11);
            }
            local_13c8->nSupersAll = uVar11;
            if ((long)local_13c8->nLines < 1) {
              uVar11 = 0;
            }
            else {
              lVar14 = 0;
              uVar11 = 0;
              do {
                uVar11 = uVar11 + (*(uint *)&local_13c8->ppSupers[lVar14]->field_0x4 & 1);
                lVar14 = lVar14 + 1;
              } while (local_13c8->nLines != lVar14);
            }
            if (uVar11 != *piVar4) {
              printf("The number of gates read (%d) is different what the file says (%d).\n",
                     (ulong)uVar11);
            }
            *piVar4 = uVar11;
            return 1;
          }
          pcVar7 = "Suspicious number of lines (%d).\n";
        }
      }
      printf(pcVar7);
      return 0;
    }
  }
  printf("Supergate library \"%s\" requires the use of genlib library \"%s\".\n",local_13d0,pcVar7);
  return 0;
}

Assistant:

int Map_LibraryReadFileTreeStr( Map_SuperLib_t * pLib, Mio_Library_t * pGenlib, Vec_Str_t * vStr, char * pFileName )
{
    ProgressBar * pProgress;
    char pBuffer[5000];
    Map_Super_t * pGate;
    char * pTemp = 0, * pLibName;
    int nCounter, k, i;
    int RetValue, nPos = 0;

    // skip empty and comment lines
//    while ( fgets( pBuffer, 5000, pFile ) != NULL )
    while ( 1 )
    {
        RetValue = Vec_StrGets( pBuffer, 5000, vStr, &nPos );
        if ( RetValue == 0 )
            return 0;
        // skip leading spaces
        for ( pTemp = pBuffer; *pTemp == ' ' || *pTemp == '\r' || *pTemp == '\n'; pTemp++ );
        // skip comment lines and empty lines
        if ( *pTemp != 0 && *pTemp != '#' )
            break;
    }

    pLibName = strtok( pTemp, " \t\r\n" );
//    pLib->pGenlib = (Mio_Library_t *)Abc_FrameReadLibGen();
    pLib->pGenlib = pGenlib;
//    if ( pLib->pGenlib == NULL || strcmp( , pLibName ) )
    if ( pLib->pGenlib == NULL || Map_LibraryCompareLibNames(Mio_LibraryReadName(pLib->pGenlib), pLibName) )
    {
        printf( "Supergate library \"%s\" requires the use of genlib library \"%s\".\n", pFileName, pLibName );
        return 0;
    }

    // read the number of variables
    RetValue = Vec_StrGets( pBuffer, 5000, vStr, &nPos );
    if ( RetValue == 0 )
        return 0;
    RetValue = sscanf( pBuffer, "%d\n", &pLib->nVarsMax );
    if ( pLib->nVarsMax < 2 || pLib->nVarsMax > 10 )
    {
        printf( "Suspicious number of variables (%d).\n", pLib->nVarsMax );
        return 0;
    }

    // read the number of gates
    RetValue = Vec_StrGets( pBuffer, 5000, vStr, &nPos );
    if ( RetValue == 0 )
        return 0;
    RetValue = sscanf( pBuffer, "%d\n", &pLib->nSupersReal );
    if ( pLib->nSupersReal < 1 || pLib->nSupersReal > 10000000 )
    {
        printf( "Suspicious number of gates (%d).\n", pLib->nSupersReal );
        return 0;
    }

    // read the number of lines
    RetValue = Vec_StrGets( pBuffer, 5000, vStr, &nPos );
    if ( RetValue == 0 )
        return 0;
    RetValue = sscanf( pBuffer, "%d\n", &pLib->nLines );
    if ( pLib->nLines < 1 || pLib->nLines > 10000000 )
    {
        printf( "Suspicious number of lines (%d).\n", pLib->nLines );
        return 0;
    }

    // allocate room for supergate pointers
    pLib->ppSupers = ABC_ALLOC( Map_Super_t *, pLib->nLines + 10000 );

    // create the elementary supergates
    for ( i = 0; i < pLib->nVarsMax; i++ )
    {
        // get a new gate
        pGate = (Map_Super_t *)Extra_MmFixedEntryFetch( pLib->mmSupers );
        memset( pGate, 0, sizeof(Map_Super_t) );
        // assign the elementary variable, the truth table, and the delays
        pGate->Num = i;
        // set the truth table
        pGate->uTruth[0] = pLib->uTruths[i][0];
        pGate->uTruth[1] = pLib->uTruths[i][1];
        // set the arrival times of all input to non-existent delay
        for ( k = 0; k < pLib->nVarsMax; k++ )
        {
            pGate->tDelaysR[k].Rise = pGate->tDelaysR[k].Fall = MAP_NO_VAR;
            pGate->tDelaysF[k].Rise = pGate->tDelaysF[k].Fall = MAP_NO_VAR;
        }
        // set an existent arrival time for rise and fall
        pGate->tDelaysR[i].Rise = 0.0;
        pGate->tDelaysF[i].Fall = 0.0;
        // set the gate
        pLib->ppSupers[i] = pGate;
    }

    // read the lines
    nCounter = pLib->nVarsMax;
    pProgress = Extra_ProgressBarStart( stdout, pLib->nLines );
//    while ( fgets( pBuffer, 5000, pFile ) != NULL )
    while ( Vec_StrGets( pBuffer, 5000, vStr, &nPos ) )
    {
        for ( pTemp = pBuffer; *pTemp == ' ' || *pTemp == '\r' || *pTemp == '\n'; pTemp++ );
        if ( pTemp[0] == '\0' )
            continue;
//        if ( pTemp[0] == 'a' || pTemp[2] == 'a' )
//        {
//            pLib->nLines--;
//            continue;
//        }

        // get the gate
        pGate = Map_LibraryReadGateTree( pLib, pTemp, nCounter, pLib->nVarsMax );
        if ( pGate == NULL )
        {
            Extra_ProgressBarStop( pProgress );
            return 0;
        }
        pLib->ppSupers[nCounter++] = pGate;
        // later we will derive: truth table, delays, area, number of component gates, etc

        // update the progress bar
        Extra_ProgressBarUpdate( pProgress, nCounter, NULL );
    }
    Extra_ProgressBarStop( pProgress );
    if ( nCounter != pLib->nLines )
        printf( "The number of lines read (%d) is different from what the file says (%d).\n", nCounter, pLib->nLines );
    pLib->nSupersAll = nCounter;
    // count the number of real supergates
    nCounter = 0;
    for ( k = 0; k < pLib->nLines; k++ )
        nCounter += pLib->ppSupers[k]->fSuper;
    if ( nCounter != pLib->nSupersReal )
        printf( "The number of gates read (%d) is different what the file says (%d).\n", nCounter, pLib->nSupersReal );
    pLib->nSupersReal = nCounter;
    return 1;
}